

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O1

shared_ptr<const_Assimp::FIValue> __thiscall
Assimp::FIHexDecoder::decode(FIHexDecoder *this,uint8_t *data,size_t len)

{
  long in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  shared_ptr<const_Assimp::FIValue> sVar2;
  allocator_type local_3a;
  undefined1 local_39;
  FIHexDecoder local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  void *local_28 [3];
  
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_28,(uchar *)len,
             (uchar *)(in_RCX + len),&local_3a);
  local_38 = (FIHexDecoder)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Assimp::FIHexValueImpl,std::allocator<Assimp::FIHexValueImpl>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            (&_Stack_30,(FIHexValueImpl **)&local_38,(allocator<Assimp::FIHexValueImpl> *)&local_39,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28);
  *this = local_38;
  this[1] = (FIHexDecoder)_Stack_30._M_pi;
  _Var1._M_pi = extraout_RDX;
  if (local_28[0] != (void *)0x0) {
    operator_delete(local_28[0]);
    _Var1._M_pi = extraout_RDX_00;
  }
  sVar2.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  sVar2.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<const_Assimp::FIValue>)
         sVar2.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual std::shared_ptr<const FIValue> decode(const uint8_t *data, size_t len) /*override*/ {
        return FIHexValue::create(std::vector<uint8_t>(data, data + len));
    }